

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPrint.c
# Opt level: O3

void Abc_NtkPrintFanio(FILE *pFile,Abc_Ntk_t *pNtk,int fUseFanio,int fUsePio,int fUseSupp,
                      int fUseCone)

{
  Vec_Int_t *vFan;
  Vec_Int_t *vFon;
  Vec_Int_t *vFanR;
  Vec_Int_t *vFonR;
  char *pFanout;
  char *pFanouts;
  char *pFanins;
  char *pNode;
  char *pFanin;
  
  vFan = (Vec_Int_t *)calloc(1,0x10);
  vFon = (Vec_Int_t *)calloc(1,0x10);
  vFanR = (Vec_Int_t *)calloc(1,0x10);
  vFonR = (Vec_Int_t *)calloc(1,0x10);
  if (fUseSupp + fUseCone + fUsePio + fUseFanio != 1) {
    __assert_fail("fUseFanio + fUsePio + fUseSupp + fUseCone == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcPrint.c"
                  ,0x357,"void Abc_NtkPrintFanio(FILE *, Abc_Ntk_t *, int, int, int, int)");
  }
  if (fUseFanio == 0) {
    if (fUsePio != 0) {
      Abc_NtkInputOutputCounters(pNtk,vFan,vFon,vFanR,vFonR);
      pNode = "I/O";
      goto LAB_002f0559;
    }
    if (fUseSupp == 0) {
      if (fUseCone == 0) goto LAB_002f0579;
      Abc_NtkInOutConeCounters(pNtk,vFan,vFon,vFanR,vFonR);
      pFanout = "out-cone";
      pFanins = "input cones";
      pFanouts = "output cones";
      pNode = "I/O";
      pFanin = "in-cone";
    }
    else {
      Abc_NtkInOutSupportCounters(pNtk,vFan,vFon,vFanR,vFonR);
      pFanout = "out-supp";
      pFanins = "input supports";
      pFanouts = "output supports";
      pNode = "I/O";
      pFanin = "in-supp";
    }
  }
  else {
    Abc_NtkFaninFanoutCounters(pNtk,vFan,vFon,vFanR,vFonR);
    pNode = "Nodes";
LAB_002f0559:
    pFanins = "fanins";
    pFanouts = "fanouts";
    pFanout = "fanout";
    pFanin = "fanin";
  }
  Abc_NtkPrintDistribInternal
            (pFile,pNtk,pFanins,pFanouts,pNode,pFanin,pFanout,vFan,vFon,vFanR,vFonR);
LAB_002f0579:
  if (vFan->pArray != (int *)0x0) {
    free(vFan->pArray);
  }
  free(vFan);
  if (vFon->pArray != (int *)0x0) {
    free(vFon->pArray);
  }
  free(vFon);
  if (vFanR->pArray != (int *)0x0) {
    free(vFanR->pArray);
  }
  free(vFanR);
  if (vFonR->pArray != (int *)0x0) {
    free(vFonR->pArray);
  }
  free(vFonR);
  return;
}

Assistant:

void Abc_NtkPrintFanio( FILE * pFile, Abc_Ntk_t * pNtk, int fUseFanio, int fUsePio, int fUseSupp, int fUseCone )
{
    Vec_Int_t * vFan = Vec_IntAlloc( 0 );
    Vec_Int_t * vFon = Vec_IntAlloc( 0 );
    Vec_Int_t * vFanR = Vec_IntAlloc( 0 );
    Vec_Int_t * vFonR = Vec_IntAlloc( 0 );
    assert( fUseFanio + fUsePio + fUseSupp + fUseCone == 1 );
    if ( fUseFanio )
    {
        Abc_NtkFaninFanoutCounters( pNtk, vFan, vFon, vFanR, vFonR );
        Abc_NtkPrintDistribInternal( pFile, pNtk, "fanins", "fanouts", "Nodes", "fanin", "fanout", vFan, vFon, vFanR, vFonR ); 
    }
    else if ( fUsePio )
    {
        Abc_NtkInputOutputCounters( pNtk, vFan, vFon, vFanR, vFonR );
        Abc_NtkPrintDistribInternal( pFile, pNtk, "fanins", "fanouts", "I/O", "fanin", "fanout", vFan, vFon, vFanR, vFonR ); 
    }
    else if ( fUseSupp )
    {
        Abc_NtkInOutSupportCounters( pNtk, vFan, vFon, vFanR, vFonR );
        Abc_NtkPrintDistribInternal( pFile, pNtk, "input supports", "output supports", "I/O", "in-supp", "out-supp", vFan, vFon, vFanR, vFonR ); 
    }
    else if ( fUseCone )
    {
        Abc_NtkInOutConeCounters( pNtk, vFan, vFon, vFanR, vFonR );
        Abc_NtkPrintDistribInternal( pFile, pNtk, "input cones", "output cones", "I/O", "in-cone", "out-cone", vFan, vFon, vFanR, vFonR ); 
    }
    Vec_IntFree( vFan );
    Vec_IntFree( vFon );
    Vec_IntFree( vFanR );
    Vec_IntFree( vFonR );
}